

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O2

string * __thiscall
CodeGenerator::generate_python_code_abi_cxx11_(string *__return_storage_ptr__,CodeGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"# Generated by program-homework-solver \n\ndef f(x):\n\tanswer = ",
                 &this->func);
  std::operator+(__return_storage_ptr__,&local_30,
                 "\n\treturn answer\n\nfor i in range(0,20):\n\tprint(f(i))\n");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string CodeGenerator::generate_python_code() {
    string code =
            "# Generated by program-homework-solver \n\n"
            "def f(x):\n"
            "\tanswer = " + CodeGenerator::func + "\n"
            "\treturn answer\n"
            "\nfor i in range(0,20):\n"
            "\tprint(f(i))\n";

    return code;
}